

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

bool matches_objectName_non_null(QObject *obj,QAnyStringView name)

{
  long lVar1;
  bool bVar2;
  QObjectPrivate *pQVar3;
  QString *in_RDI;
  long in_FS_OFFSET;
  ExtraData *ext;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  ExtraData *lhs;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QObjectPrivate::get((QObject *)0x3eedeb);
  lhs = pQVar3->extraData;
  if (lhs == (ExtraData *)0x0) {
    bVar2 = QAnyStringView::isEmpty((QAnyStringView *)0x3eee38);
  }
  else {
    QPropertyData<QString>::valueBypassingBindings(&(lhs->objectName).super_QPropertyData<QString>);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
               in_RDI);
    bVar2 = operator==((QAnyStringView *)lhs,
                       (QAnyStringView *)
                       CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool matches_objectName_non_null(QObject *obj, QAnyStringView name)
{
    if (auto ext = QObjectPrivate::get(obj)->extraData)
        return ext ->objectName.valueBypassingBindings() == name;
    return name.isEmpty();
}